

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_rawset(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQTable *this;
  SQClass *this_00;
  SQSharedState *ss;
  SQInstance *this_01;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *key;
  SQObjectPtr *val;
  char *err;
  SQRESULT SVar4;
  
  pSVar3 = stack_get(v,idx);
  key = SQVM::GetUp(v,-2);
  if ((key->super_SQObject)._type == OT_NULL) {
    SQVM::Pop(v,2);
    err = "null key";
LAB_0011489f:
    sq_throwerror(v,err);
LAB_001148a7:
    SVar4 = -1;
  }
  else {
    SVar1 = (pSVar3->super_SQObject)._type;
    if (SVar1 == OT_ARRAY) {
      val = SQVM::GetUp(v,-1);
      bVar2 = SQVM::Set(v,pSVar3,key,val,0);
LAB_00114971:
      if (bVar2 == false) {
        pSVar3 = SQVM::GetUp(v,-2);
        SQVM::Raise_IdxError(v,pSVar3);
        goto LAB_001148a7;
      }
    }
    else {
      if (SVar1 == OT_CLASS) {
        this_00 = (pSVar3->super_SQObject)._unVal.pClass;
        ss = v->_sharedstate;
        pSVar3 = SQVM::GetUp(v,-1);
        SQClass::NewSlot(this_00,ss,key,pSVar3,false);
        SQVM::Pop(v,2);
        return 0;
      }
      if (SVar1 == OT_INSTANCE) {
        this_01 = (pSVar3->super_SQObject)._unVal.pInstance;
        pSVar3 = SQVM::GetUp(v,-1);
        bVar2 = SQInstance::Set(this_01,key,pSVar3);
        goto LAB_00114971;
      }
      if (SVar1 != OT_TABLE) {
        SQVM::Pop(v,2);
        err = "rawset works only on array/table/class and instance";
        goto LAB_0011489f;
      }
      this = (pSVar3->super_SQObject)._unVal.pTable;
      pSVar3 = SQVM::GetUp(v,-1);
      SQTable::NewSlot(this,key,pSVar3);
    }
    SQVM::Pop(v,2);
    SVar4 = 0;
  }
  return SVar4;
}

Assistant:

SQRESULT sq_rawset(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self = stack_get(v, idx);
    SQObjectPtr &key = v->GetUp(-2);
    if(type(key) == OT_NULL) {
        v->Pop(2);
        return sq_throwerror(v, _SC("null key"));
    }
    switch(type(self)) {
    case OT_TABLE:
        _table(self)->NewSlot(key, v->GetUp(-1));
        v->Pop(2);
        return SQ_OK;
    break;
    case OT_CLASS:
        _class(self)->NewSlot(_ss(v), key, v->GetUp(-1),false);
        v->Pop(2);
        return SQ_OK;
    break;
    case OT_INSTANCE:
        if(_instance(self)->Set(key, v->GetUp(-1))) {
            v->Pop(2);
            return SQ_OK;
        }
    break;
    case OT_ARRAY:
        if(v->Set(self, key, v->GetUp(-1),false)) {
            v->Pop(2);
            return SQ_OK;
        }
    break;
    default:
        v->Pop(2);
        return sq_throwerror(v, _SC("rawset works only on array/table/class and instance"));
    }
    v->Raise_IdxError(v->GetUp(-2));return SQ_ERROR;
}